

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Parser * __thiscall
Catch::Clara::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,ExeName *other)

{
  Parser PStack_78;
  
  Parser(&PStack_78,this);
  ExeName::operator=(&PStack_78.m_exeName,other);
  Parser(__return_storage_ptr__,&PStack_78);
  ~Parser(&PStack_78);
  return __return_storage_ptr__;
}

Assistant:

auto operator|(T const& other) const -> Parser {
                return Parser(*this) |= other;
            }